

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ciphersuites.h
# Opt level: O0

int mbedtls_ssl_ciphersuite_uses_server_signature(mbedtls_ssl_ciphersuite_t *info)

{
  mbedtls_ssl_ciphersuite_t *info_local;
  
  info_local._4_4_ = (uint)(info->key_exchange - 2 < 3);
  return info_local._4_4_;
}

Assistant:

static inline int mbedtls_ssl_ciphersuite_uses_server_signature(
    const mbedtls_ssl_ciphersuite_t *info)
{
    switch (info->MBEDTLS_PRIVATE(key_exchange)) {
        case MBEDTLS_KEY_EXCHANGE_DHE_RSA:
        case MBEDTLS_KEY_EXCHANGE_ECDHE_RSA:
        case MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA:
            return 1;

        default:
            return 0;
    }
}